

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  FILE *__stream;
  long lVar5;
  long lVar6;
  __sighandler_t p_Var7;
  dtl_hv_t *config;
  uint uVar8;
  _Bool ok;
  char local_58 [40];
  
  m_shutdownTimer = 10;
  m_runFlag = 1;
  if ((uint)argc < 2) {
    iVar3 = 0;
    printf("Usage:\n%s configFile.json\n",*argv);
  }
  else {
    printf("APX Server %s\n\n","0.3.1");
    iVar3 = 1;
    uVar8 = 1;
    if (argv[1] != (char *)0x0) {
      __stream = fopen(argv[1],"r");
      if (__stream == (FILE *)0x0) {
        uVar8 = 0x31;
      }
      else {
        lVar5 = dtl_json_load(__stream);
        fclose(__stream);
        if (lVar5 == 0) {
          uVar8 = 3;
        }
        else {
          iVar2 = dtl_dv_type(lVar5);
          if (iVar2 == 4) {
            printf("Loading %s: ",argv[1]);
            puts("OK");
            lVar6 = dtl_hv_get_cstr(lVar5,"server");
            if ((((lVar6 != 0) && (iVar3 = dtl_dv_type(lVar6), iVar3 == 4)) &&
                (lVar6 = dtl_hv_get_cstr(lVar6,"shutdown-timer"), lVar6 != 0)) &&
               (iVar4 = dtl_sv_to_i32(lVar6,local_58), local_58[0] == '\x01')) {
              m_shutdownTimer = iVar4;
            }
            p_Var7 = signal(2,signal_handler);
            if (p_Var7 == (__sighandler_t)0x1) {
              signal(2,(__sighandler_t)0x1);
            }
            p_Var7 = signal(0xf,signal_handler);
            if (p_Var7 == (__sighandler_t)0x1) {
              signal(0xf,(__sighandler_t)0x1);
            }
            apx_server_create(&m_server);
            config = (dtl_hv_t *)dtl_hv_get_cstr(lVar5,"extension");
            if ((config != (dtl_hv_t *)0x0) && (iVar3 = dtl_dv_type(config), iVar3 == 4)) {
              register_apx_server_extensions(&m_server,config);
            }
            apx_server_start(&m_server);
            while (iVar4 = m_shutdownTimer, m_runFlag != 0) {
              usleep(1000000);
              if (0 < m_shutdownTimer) {
                iVar4 = m_shutdownTimer + -1;
                if (iVar4 == 0) break;
                bVar1 = (uint)m_shutdownTimer < 0xb;
                m_shutdownTimer = iVar4;
                if (bVar1) {
                  sprintf(local_58,"Shutdown in %ds");
                  apx_server_log_event(&m_server,3,"main",local_58);
                }
              }
            }
            m_shutdownTimer = iVar4;
            puts("Server shutdown started");
            apx_server_destroy(&m_server);
            dtl_dv_dec_ref(lVar5);
            puts("Server shutdown complete");
            return 0;
          }
          dtl_dv_dec_ref(lVar5);
          uVar8 = 0x43;
        }
      }
    }
    printf("Loading %s: ",argv[1]);
    printf("Error %d\n",(ulong)uVar8);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   apx_error_t result;
   dtl_hv_t *server_config = (dtl_hv_t*) 0;

   m_shutdownTimer = SHUTDOWN_TIMER_INIT;   
   m_runFlag = 1;

   if (argc < 2u)
   {
      printUsage(argv[0]);
      return 0;
   }
   printf("APX Server %s\n\n", SW_VERSION_STR);
   result = load_config_file(argv[1], &server_config);
   printf("Loading %s: ", argv[1]);
   if (result != APX_NO_ERROR)
   {
      printf("Error %d\n", (int) result);
      return 1;
   }
   else
   {
      printf("OK\n");
      dtl_dv_t *tmp = dtl_hv_get_cstr(server_config, "server");
      if ( (tmp != 0) && (dtl_dv_type(tmp) == DTL_DV_HASH) )
      {
         int32_t i32;
         bool ok;
         dtl_hv_t *serverCfg = (dtl_hv_t*) tmp;
         dtl_sv_t *svShutdownTimer = (dtl_sv_t*) dtl_hv_get_cstr(serverCfg, "shutdown-timer");
         if (svShutdownTimer != 0)
         {
            i32 = dtl_sv_to_i32(svShutdownTimer, &ok);
            if (ok)
            {
               m_shutdownTimer = i32;
            }
         }
      }
   }

#ifdef _WIN32
   if (init_wsa() != 0)
   {
      int err = WSAGetLastError();
      fprintf(stderr, "WSAStartup failed with error: %d\n", err);
      return 1;
   }
#else
   signal_handler_setup();
#endif
   apx_server_create(&m_server);
   if (server_config != 0)
   {
      dtl_dv_t *extension_config = (dtl_dv_t*) 0;
      extension_config = dtl_hv_get_cstr(server_config, "extension");
      if ( (extension_config != 0) && (dtl_dv_type(extension_config) == DTL_DV_HASH) )
      {
         register_apx_server_extensions(&m_server, (dtl_hv_t*) extension_config);
      }
   }
   apx_server_start(&m_server);
   while(m_runFlag != 0)
   {
      SLEEP(1000); //main thread is sleeping while child threads do all the work
      if (m_shutdownTimer > 0)
      {
         if (--m_shutdownTimer==0) //this counter is used during a cleanup test to verify that all resources are properly cleaned up
         {
            break;
         }
         if (m_shutdownTimer < SHUTDOWN_TIMER_WARN_THRESHOLD)
         {
            char msg[40];
            sprintf(msg, "Shutdown in %ds", m_shutdownTimer);
            apx_server_log_event(&m_server, APX_LOG_LEVEL_INFO, "main", msg);
         }
      }
   }
   printf("Server shutdown started\n");
   apx_server_destroy(&m_server);
   dtl_dec_ref(server_config);
   printf("Server shutdown complete\n");
#ifdef _WIN32
   WSACleanup();
#endif
#if defined(_MSC_VER) && (CLEANUP_TEST != 0)
   _CrtDumpMemoryLeaks();
#endif
   return 0;
}